

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O3

void __thiscall
SoundConfigTab::rescan<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group)

{
  QComboBox *pQVar1;
  int iVar2;
  bool bVar3;
  QString current;
  QString local_60;
  QVariant local_48;
  
  bVar3 = SUB81(group->mDeviceCombo,0);
  QObject::blockSignals(bVar3);
  QComboBox::currentText();
  iVar2 = QComboBox::currentIndex();
  AudioEnumerator::populate(enumerator,iVar2);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  pQVar1 = group->mDeviceCombo;
  QVariant::QVariant(&local_48,&local_60);
  iVar2 = QComboBox::findData(pQVar1,&local_48,0,0x10);
  QVariant::~QVariant(&local_48);
  if (iVar2 == -1) {
    ConfigTab::setDirty<(Config::Category)1>(&this->super_ConfigTab);
  }
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
    }
  }
  QObject::blockSignals(bVar3);
  return;
}

Assistant:

void SoundConfigTab::rescan(Enumerator &enumerator, DeviceGroup *group) {
    QSignalBlocker blocker(group->mDeviceCombo);

    // save the current selection
    auto const current = group->mDeviceCombo->currentText();

    // rescan the device list and update the combo
    enumerator.populate(group->mApiCombo->currentIndex());
    group->populateDevices(enumerator);

    // search for the current in the new list, defaulting to 0 if not found
    auto index = group->mDeviceCombo->findText(current);
    if (index == -1) {
        // not found, select the first
        index = 0;
        setDirtyFromEnumerator<Enumerator>();
    }
    group->mDeviceCombo->setCurrentIndex(index);
}